

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser-internal.h
# Opt level: O3

void __thiscall
wasm::WATParser::WithPosition<wasm::WATParser::ParseImplicitTypeDefsCtx>::~WithPosition
          (WithPosition<wasm::WATParser::ParseImplicitTypeDefsCtx> *this)

{
  ParseImplicitTypeDefsCtx *pPVar1;
  pointer pAVar2;
  
  pPVar1 = this->ctx;
  (pPVar1->in).pos = (ulong)this->original;
  pAVar2 = (pPVar1->in).annotations.
           super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((pPVar1->in).annotations.
      super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>.
      _M_impl.super__Vector_impl_data._M_finish != pAVar2) {
    (pPVar1->in).annotations.
    super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>.
    _M_impl.super__Vector_impl_data._M_finish = pAVar2;
  }
  Lexer::skipSpace(&pPVar1->in);
  std::vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::
  _M_move_assign(&(this->ctx->in).annotations,&this->annotations);
  pAVar2 = (this->annotations).
           super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pAVar2 != (pointer)0x0) {
    operator_delete(pAVar2,(long)(this->annotations).
                                 super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pAVar2);
    return;
  }
  return;
}

Assistant:

~WithPosition() {
    ctx.in.setPos(original);
    ctx.in.setAnnotations(std::move(annotations));
  }